

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O1

int __thiscall
ncnn::Yolov3DetectionOutput::forward
          (Yolov3DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  undefined4 uVar1;
  int iVar2;
  pointer pMVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  iterator __position;
  Mat *this_01;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar10;
  int iVar11;
  Allocator *pAVar12;
  undefined4 *puVar13;
  byte bVar14;
  ulong uVar15;
  BBoxRect *__args;
  ulong uVar16;
  ulong uVar17;
  Yolov3DetectionOutput *this_02;
  long lVar18;
  float *pfVar19;
  size_type sVar20;
  float *pfVar21;
  uint _h;
  long lVar22;
  ulong uVar23;
  pointer piVar24;
  ulong uVar25;
  float *pfVar26;
  float fVar27;
  undefined1 auVar28 [12];
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar34;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  undefined1 local_1a8 [8];
  BBoxRect *pBStack_1a0;
  BBoxRect *local_198;
  BBoxRect local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Alloc_hider local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  pointer local_128;
  pointer local_120;
  pointer local_118;
  float *local_110;
  pointer local_108;
  Yolov3DetectionOutput *local_100;
  float local_f8;
  float fStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined1 local_e8 [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_d8;
  Option *local_d0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_c8;
  int *local_c0;
  size_t local_b8;
  Allocator *local_b0;
  Allocator *local_a8;
  pointer local_a0;
  float *local_98;
  ulong local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_168._M_allocated_capacity = 0;
  local_168._8_8_ = (void *)0x0;
  local_158._M_p = (pointer)0x0;
  this_02 = this;
  local_d8 = top_blobs;
  local_d0 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    piVar24 = (pointer)0x0;
    local_100 = this;
    local_c8 = bottom_blobs;
    do {
      pvVar10 = local_c8;
      local_1a8 = (undefined1  [8])0x0;
      pBStack_1a0 = (BBoxRect *)0x0;
      local_198 = (BBoxRect *)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                *)local_1a8,(long)this->num_box);
      pMVar3 = (pvVar10->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar11 = pMVar3[(long)piVar24].c / this->num_box;
      if (iVar11 != this->num_class + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   *)local_1a8);
        iVar11 = -1;
        goto LAB_002b78dc;
      }
      local_128 = piVar24;
      if (0 < this->num_box) {
        local_120 = pMVar3 + (long)piVar24;
        local_90._0_4_ = local_120->w;
        local_90._4_4_ = local_120->h;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = local_90;
        local_68._0_4_ = (float)(int)(undefined4)local_90;
        local_68._4_4_ = (undefined4)(int)local_90._4_4_;
        pvVar4 = (this->anchors_scale).data;
        fVar27 = *(float *)((long)pvVar4 + (long)piVar24 * 4);
        auVar37._0_4_ = -(uint)(0 < (int)(undefined4)local_90);
        auVar37._4_4_ = -(uint)(0 < (int)(undefined4)local_90);
        auVar37._8_4_ = -(uint)(0 < (int)local_90._4_4_);
        auVar37._12_4_ = -(uint)(0 < (int)local_90._4_4_);
        local_148._12_4_ = movmskpd((int)pvVar4,auVar37);
        bVar14 = (byte)local_148._12_4_;
        local_88 = (float)(int)(fVar27 * local_68._0_4_);
        fStack_84 = (float)(int)(fVar27 * (float)local_68._4_4_);
        fStack_80 = (float)(int)(fVar27 * 0.0);
        fStack_7c = (float)(int)(fVar27 * 0.0);
        local_b8 = (size_t)iVar11;
        local_b0 = (Allocator *)(ulong)(uint)local_90._4_4_;
        local_90 = local_90 & 0xffffffff;
        register0x000012c8 = 0x3f0000003f000000;
        auVar29 = rcpps(auVar29,_local_68);
        local_78 = auVar29._0_4_;
        fStack_74 = auVar29._4_4_;
        fStack_70 = auVar29._8_4_;
        fStack_6c = auVar29._12_4_;
        local_78 = (1.0 - local_68._0_4_ * local_78) * local_78 + local_78;
        fStack_74 = (1.0 - (float)local_68._4_4_ * fStack_74) * fStack_74 + fStack_74;
        fStack_70 = (1.0 - fStack_70 * 0.5) * fStack_70 + fStack_70;
        fStack_6c = (1.0 - fStack_6c * 0.5) * fStack_6c + fStack_6c;
        local_c0 = (int *)((long)this->num_box * (long)piVar24 * 4);
        sVar20 = 0;
        do {
          lVar18 = sVar20 * local_b8;
          local_150 = (size_type)local_120->w;
          if (local_120->dims == 3) {
            uVar25 = local_120->elemsize;
            local_118 = (pointer)((lVar18 + 5) * local_120->cstep * uVar25 + (long)local_120->data);
            lVar22 = (long)local_120->h * local_150 * uVar25;
          }
          else {
            uVar25 = local_120->elemsize;
            local_118 = (pointer)((lVar18 + 5) * local_120->cstep * uVar25 + (long)local_120->data);
            lVar22 = (long)local_120->h * local_150 * (long)local_120->d * uVar25;
          }
          local_148._M_allocated_capacity = sVar20;
          if (bVar14 >> 1 != 0) {
            sVar5 = local_120->cstep;
            pvVar4 = local_120->data;
            sVar6 = local_120->elemsize;
            local_108 = (pointer)(sVar5 * lVar18 * sVar6 + (long)pvVar4);
            local_110 = (float *)((lVar18 + 1) * sVar5 * sVar6 + (long)pvVar4);
            pfVar26 = (float *)((lVar18 + 2) * sVar5 * sVar6 + (long)pvVar4);
            pfVar21 = (float *)((lVar18 + 3) * sVar5 * sVar6 + (long)pvVar4);
            pfVar19 = (float *)((lVar18 + 4) * sVar5 * sVar6 + (long)pvVar4);
            uVar23 = lVar22 + 0xfU & 0xfffffffffffffff0;
            local_150 = local_150 * uVar25;
            register0x00001248 =
                 *(undefined8 *)
                  ((long)(this->biases).data +
                  (long)((int)*(float *)((long)local_c0 +
                                        (long)(sVar20 * 4 + (long)(this->mask).data)) * 2) * 4);
            local_58 = 0x3f8000003f800000;
            pAVar12 = (Allocator *)0x0;
            do {
              local_a8 = pAVar12;
              if ((local_148._12_4_ & 1) != 0) {
                local_48 = (float)(int)pAVar12;
                local_a0 = (pointer)(local_150 * (long)pAVar12 + (long)local_118);
                fStack_40 = local_88;
                fStack_3c = fStack_84;
                uVar16 = 0;
                fStack_44 = local_48;
                do {
                  if ((long)this->num_class < 1) {
                    iVar11 = 0;
                    auVar28 = ZEXT812(0xff7fffff);
                  }
                  else {
                    uVar15 = 0;
                    uVar17 = 0;
                    auVar28 = ZEXT812(0xff7fffff);
                    do {
                      fVar27 = *(float *)((long)local_a0 +
                                         (uVar23 - uVar23 % uVar25) * uVar15 + uVar16 * 4);
                      fVar41 = auVar28._0_4_;
                      if (fVar41 < fVar27) {
                        uVar17 = uVar15 & 0xffffffff;
                      }
                      iVar11 = (int)uVar17;
                      if (fVar27 <= fVar41) {
                        fVar27 = fVar41;
                      }
                      auVar28._4_8_ = 0;
                      auVar28._0_4_ = fVar27;
                      uVar15 = uVar15 + 1;
                    } while ((long)this->num_class != uVar15);
                  }
                  local_e8._12_4_ = 0;
                  local_e8._0_12_ = auVar28;
                  local_138 = expf(-*pfVar19);
                  fVar27 = expf(-local_e8._0_4_);
                  fVar27 = 1.0 / ((fVar27 + 1.0) * local_138 + 1.0);
                  if (local_100->confidence_threshold <= fVar27) {
                    auVar29 = ZEXT416((uint)*local_110);
                    local_f8 = -*(float *)&local_108->data;
                    fStack_f4 = -*local_110;
                    uStack_f0 = 0x80000000;
                    uStack_ec = 0x80000000;
                    local_e8._0_4_ = fVar27;
                    local_98 = pfVar19;
                    local_138 = expf(local_f8);
                    fStack_134 = extraout_XMM0_Db;
                    fVar27 = expf(fStack_f4);
                    local_138 = local_138 + 1.0;
                    fStack_130 = fStack_134 + 0.0;
                    fStack_12c = extraout_XMM0_Db_00 + 0.0;
                    fStack_134 = fVar27 + 1.0;
                    local_f8 = expf(*pfVar26);
                    fVar27 = expf(*pfVar21);
                    local_188.score = (float)local_e8._0_4_;
                    auVar9._4_4_ = fStack_134;
                    auVar9._0_4_ = local_138;
                    auVar9._8_4_ = fStack_130;
                    auVar9._12_4_ = fStack_12c;
                    auVar29 = rcpps(auVar29,auVar9);
                    auVar36._0_4_ = (float)local_58._0_4_ * auVar29._0_4_;
                    auVar36._4_4_ = (float)local_58._4_4_ * auVar29._4_4_;
                    auVar36._8_4_ = fStack_50 * auVar29._8_4_;
                    auVar36._12_4_ = fStack_4c * auVar29._12_4_;
                    fVar30 = ((float)local_58._4_4_ - fStack_134 * auVar36._4_4_) * auVar29._4_4_ +
                             auVar36._4_4_;
                    auVar7._4_8_ = auVar29._8_8_;
                    auVar7._0_4_ = fStack_44;
                    auVar32._0_8_ = auVar7._0_8_ << 0x20;
                    auVar32._8_4_ = fStack_40;
                    auVar32._12_4_ = fStack_3c;
                    auVar33._4_12_ = auVar32._4_12_;
                    auVar33._0_4_ = (float)(int)uVar16;
                    auVar37 = rcpps(auVar36,auVar33);
                    fVar40 = fVar30 * auVar37._4_4_;
                    local_188.area = local_f8 * fStack_50 * auVar37._8_4_;
                    fVar41 = fVar27 * fStack_4c * auVar37._12_4_;
                    local_188.area =
                         (local_f8 * fStack_50 - fStack_40 * local_188.area) * auVar37._8_4_ +
                         local_188.area;
                    fVar41 = (fVar27 * fStack_4c - fStack_3c * fVar41) * auVar37._12_4_ + fVar41;
                    fVar27 = (((float)local_58._0_4_ - local_138 * auVar36._0_4_) * auVar29._0_4_ +
                              auVar36._0_4_ + auVar33._0_4_) * local_78;
                    fVar31 = (fVar30 + fStack_44) * fStack_74;
                    fVar34 = local_188.area * fStack_60;
                    fVar35 = fVar41 * fStack_5c;
                    auVar38._4_4_ = fVar35;
                    auVar38._0_4_ = fVar34;
                    auVar38._8_4_ = fVar27;
                    auVar38._12_4_ = fVar31;
                    local_188.xmin = fVar27 - fVar34;
                    local_188.ymin = fVar31 - fVar35;
                    auVar8._4_8_ = auVar38._8_8_;
                    auVar8._0_4_ = fVar35 + ((fVar30 - fStack_44 * fVar40) * auVar37._4_4_ + fVar40)
                                            * (float)local_68._4_4_;
                    auVar39._0_8_ = auVar8._0_8_ << 0x20;
                    auVar39._8_4_ = fVar27 + fVar34;
                    auVar39._12_4_ = fVar31 + fVar35;
                    local_188.area = local_188.area * fVar41;
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)((long)local_1a8 + local_148._0_8_ * 0x18);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_188.xmax = auVar39._8_4_;
                    local_188.ymax = auVar39._12_4_;
                    local_188.label = iVar11;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,&local_188);
                      pfVar19 = local_98;
                    }
                    else {
                      (__position._M_current)->xmax = (float)(int)auVar39._8_8_;
                      (__position._M_current)->ymax = (float)(int)((ulong)auVar39._8_8_ >> 0x20);
                      (__position._M_current)->area = local_188.area;
                      (__position._M_current)->label = iVar11;
                      (__position._M_current)->score = (float)local_e8._0_4_;
                      (__position._M_current)->xmin = local_188.xmin;
                      (__position._M_current)->ymin = local_188.ymin;
                      (__position._M_current)->xmax = auVar39._8_4_;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                      pfVar19 = local_98;
                    }
                  }
                  local_108 = (pointer)((long)&local_108->data + 4);
                  local_110 = local_110 + 1;
                  pfVar26 = pfVar26 + 1;
                  pfVar21 = pfVar21 + 1;
                  pfVar19 = pfVar19 + 1;
                  uVar16 = uVar16 + 1;
                  this = local_100;
                } while (uVar16 != local_90);
              }
              pAVar12 = (Allocator *)((long)&local_a8->_vptr_Allocator + 1);
            } while (pAVar12 != local_b0);
          }
          sVar20 = local_148._M_allocated_capacity + 1;
        } while ((long)sVar20 < (long)this->num_box);
      }
      if (0 < this->num_box) {
        lVar18 = 8;
        lVar22 = 0;
        do {
          std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                    ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      *)&local_168,local_168._8_8_,*(undefined8 *)((long)local_1a8 + lVar18 + -8),
                     *(undefined8 *)
                      ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 *)local_1a8)->_M_impl).super__Vector_impl_data._M_start + lVar18));
          lVar22 = lVar22 + 1;
          lVar18 = lVar18 + 0x18;
        } while (lVar22 < this->num_box);
      }
      this_02 = (Yolov3DetectionOutput *)local_1a8;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                 *)this_02);
      piVar24 = (pointer)((long)local_128 + 1);
    } while (piVar24 < (pointer)(((long)(local_c8->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_c8->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x71c71c71c71c71c7));
  }
  if (local_168._M_allocated_capacity != local_168._8_8_) {
    this_02 = this;
    qsort_descent_inplace
              (this,(vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     *)&local_168,0,
               (int)((ulong)(local_168._8_8_ - local_168._0_8_) >> 2) * -0x49249249 + -1);
  }
  local_188.score = 0.0;
  local_188.xmin = 0.0;
  local_188.ymin = 0.0;
  local_188.xmax = 0.0;
  local_188.ymax = 0.0;
  local_188.area = 0.0;
  nms_sorted_bboxes(this_02,(vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                             *)&local_168,
                    (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188,
                    this->nms_threshold);
  local_1a8 = (undefined1  [8])0x0;
  pBStack_1a0 = (BBoxRect *)0x0;
  local_198 = (BBoxRect *)0x0;
  lVar18 = CONCAT44(local_188.xmin,local_188.score);
  if (CONCAT44(local_188.xmax,local_188.ymin) != lVar18) {
    uVar25 = 0;
    do {
      __args = (BBoxRect *)(*(long *)(lVar18 + uVar25 * 8) * 0x1c + local_168._M_allocated_capacity)
      ;
      if (pBStack_1a0 == local_198) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)local_1a8,(iterator)pBStack_1a0,__args);
      }
      else {
        fVar30 = __args->score;
        fVar31 = __args->xmin;
        fVar34 = __args->ymin;
        fVar35 = __args->xmax;
        fVar27 = __args->ymax;
        fVar41 = __args->area;
        iVar11 = __args->label;
        pBStack_1a0->xmax = __args->xmax;
        pBStack_1a0->ymax = fVar27;
        pBStack_1a0->area = fVar41;
        pBStack_1a0->label = iVar11;
        pBStack_1a0->score = fVar30;
        pBStack_1a0->xmin = fVar31;
        pBStack_1a0->ymin = fVar34;
        pBStack_1a0->xmax = fVar35;
        pBStack_1a0 = pBStack_1a0 + 1;
      }
      uVar25 = uVar25 + 1;
      lVar18 = CONCAT44(local_188.xmin,local_188.score);
    } while (uVar25 < (ulong)(CONCAT44(local_188.xmax,local_188.ymin) - lVar18 >> 3));
  }
  _h = (int)((long)pBStack_1a0 - (long)local_1a8 >> 2) * -0x49249249;
  iVar11 = 0;
  if (_h != 0) {
    this_01 = (local_d8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_01,6,_h,4,local_d0->blob_allocator);
    iVar11 = -100;
    if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
       (iVar11 = 0, 0 < (int)_h)) {
      iVar2 = this_01->w;
      sVar5 = this_01->elemsize;
      puVar13 = (undefined4 *)((long)this_01->data + 0x14);
      iVar11 = 0;
      lVar18 = 0;
      do {
        uVar1 = *(undefined4 *)
                 ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                            *)local_1a8)->_M_impl).super__Vector_impl_data._M_start + lVar18);
        puVar13[-5] = (float)(*(int *)((long)&(((pointer)((long)local_1a8 + 0x18))->
                                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                              )._M_impl.super__Vector_impl_data._M_start + lVar18) +
                             1);
        puVar13[-4] = uVar1;
        puVar13[-3] = *(undefined4 *)
                       ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                  *)local_1a8)->_M_impl).super__Vector_impl_data._M_start +
                       lVar18 + 4);
        puVar13[-2] = *(undefined4 *)
                       ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                  *)local_1a8)->_M_impl).super__Vector_impl_data._M_finish + lVar18)
        ;
        puVar13[-1] = *(undefined4 *)
                       ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                  *)local_1a8)->_M_impl).super__Vector_impl_data._M_finish +
                       lVar18 + 4);
        *puVar13 = *(undefined4 *)
                    ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               *)local_1a8)->_M_impl).super__Vector_impl_data._M_end_of_storage +
                    lVar18);
        lVar18 = lVar18 + 0x1c;
        puVar13 = (undefined4 *)((long)puVar13 + (long)iVar2 * sVar5);
      } while ((ulong)(_h & 0x7fffffff) * 0x1c != lVar18);
    }
  }
  if (local_1a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a8,(long)local_198 - (long)local_1a8);
  }
  pvVar4 = (void *)CONCAT44(local_188.xmin,local_188.score);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,CONCAT44(local_188.area,local_188.ymax) - (long)pvVar4);
  }
LAB_002b78dc:
  if ((void *)local_168._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_168._M_allocated_capacity,(long)local_158._M_p - local_168._0_8_);
  }
  return iVar11;
}

Assistant:

int Yolov3DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
        //printf("%d %d\n", net_w, net_h);

        //printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}